

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O0

int fdmustach(char *template,mustach_itf *itf,void *closure,int fd)

{
  long lVar1;
  FILE *__stream;
  int *piVar2;
  long in_FS_OFFSET;
  FILE *file;
  int rc;
  int fd_local;
  void *closure_local;
  mustach_itf *itf_local;
  char *template_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = fdopen(fd,"w");
  if (__stream == (FILE *)0x0) {
    file._0_4_ = -1;
    piVar2 = __errno_location();
    *piVar2 = 0xc;
  }
  else {
    file._0_4_ = fmustach(template,itf,closure,(FILE *)__stream);
    fclose(__stream);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)file;
  }
  __stack_chk_fail();
}

Assistant:

int fdmustach(const char *template, struct mustach_itf *itf, void *closure, int fd)
{
	int rc;
	FILE *file;

	file = fdopen(fd, "w");
	if (file == NULL) {
		rc = MUSTACH_ERROR_SYSTEM;
		errno = ENOMEM;
	} else {
		rc = fmustach(template, itf, closure, file);
		fclose(file);
	}
	return rc;
}